

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O2

void __thiscall
JsonArray_SingleElement_Test::~JsonArray_SingleElement_Test(JsonArray_SingleElement_Test *this)

{
  anon_unknown.dwarf_1f8a8::JsonArray::~JsonArray(&this->super_JsonArray);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonArray, SingleElement) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_array ()).Times (1);
        EXPECT_CALL (callbacks_, uint64_value (1)).Times (1);
        EXPECT_CALL (callbacks_, end_array ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    std::string const input = "[ 1 ]";
    p.input (gsl::make_span (input));
    p.eof ();
    EXPECT_FALSE (p.last_error ()) << "Expected the parse error to be zero";
    EXPECT_EQ (p.coordinate (), (json::coord{static_cast<unsigned> (input.length ()) + 1U, 1U}));
}